

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 jx9CompileFunction(jx9_gen_state *pGen)

{
  sxu32 sVar1;
  SyToken *pSVar2;
  SyToken *ppFunc;
  sxi32 sVar3;
  SyToken *pSVar4;
  
  pSVar2 = pGen->pIn;
  ppFunc = pGen->pEnd;
  sVar1 = pSVar2->nLine;
  pSVar4 = pSVar2 + 1;
  pGen->pIn = pSVar4;
  if ((pSVar4 < ppFunc) && ((pSVar2[1].nType & 0xc) != 0)) {
    sVar1 = pSVar2[1].nLine;
    pGen->pIn = pSVar2 + 2;
    if ((pSVar2 + 2 < ppFunc) && ((pSVar2[2].nType & 0x200) != 0)) {
      sVar3 = GenStateCompileFunc(pGen,&pSVar4->sData,0,(jx9_vm_func **)ppFunc);
      return sVar3;
    }
    sVar3 = jx9GenCompileError(pGen,1,sVar1,"Expected \'(\' after function name \'%z\'");
    if (sVar3 != -10) {
      pSVar4 = pGen->pIn;
      while( true ) {
        if (pGen->pEnd <= pSVar4) {
          return 0;
        }
        if ((pSVar4->nType & 0x40040) != 0) break;
        pSVar4 = pSVar4 + 1;
        pGen->pIn = pSVar4;
      }
      return 0;
    }
  }
  else {
    sVar3 = jx9GenCompileError(pGen,1,sVar1,"Invalid function name");
    if (sVar3 != -10) {
      pSVar4 = pGen->pIn;
      while( true ) {
        if (pGen->pEnd <= pSVar4) {
          return 0;
        }
        if ((pSVar4->nType & 0x40040) != 0) break;
        pSVar4 = pSVar4 + 1;
        pGen->pIn = pSVar4;
      }
      return 0;
    }
  }
  return -10;
}

Assistant:

static sxi32 jx9CompileFunction(jx9_gen_state *pGen)
{
	SyString *pName;
	sxi32 iFlags;
	sxu32 nLine;
	sxi32 rc;

	nLine = pGen->pIn->nLine;
	pGen->pIn++; /* Jump the 'function' keyword */
	iFlags = 0;
	if( pGen->pIn >= pGen->pEnd || (pGen->pIn->nType & (JX9_TK_ID|JX9_TK_KEYWORD)) == 0 ){
		/* Invalid function name */
		rc = jx9GenCompileError(&(*pGen), E_ERROR, nLine, "Invalid function name");
		if( rc == SXERR_ABORT ){
			return SXERR_ABORT;
		}
		/* Sychronize with the next semi-colon or braces*/
		while( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & (JX9_TK_SEMI|JX9_TK_OCB)) == 0 ){
			pGen->pIn++;
		}
		return SXRET_OK;
	}
	pName = &pGen->pIn->sData;
	nLine = pGen->pIn->nLine;
	/* Jump the function name */
	pGen->pIn++;
	if( pGen->pIn >= pGen->pEnd || (pGen->pIn->nType & JX9_TK_LPAREN) == 0 ){
		/* Syntax error */
		rc = jx9GenCompileError(pGen, E_ERROR, nLine, "Expected '(' after function name '%z'", pName);
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
		/* Sychronize with the next semi-colon or '{' */
		while( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & (JX9_TK_SEMI|JX9_TK_OCB)) == 0 ){
			pGen->pIn++;
		}
		return SXRET_OK;
	}
	/* Compile function body */
	rc = GenStateCompileFunc(&(*pGen),pName,iFlags,0);
	return rc;
}